

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_ini_path(OpenJTalk *oj,char *dir)

{
  _Bool _Var1;
  size_t sVar2;
  char *str;
  char *in_RSI;
  char temp [260];
  char *in_stack_fffffffffffffec8;
  char local_128 [272];
  char *local_18;
  
  if ((in_RSI == (char *)0x0) || (local_18 = in_RSI, sVar2 = strlen(in_RSI), sVar2 == 0)) {
    return false;
  }
  sVar2 = strlen(local_18);
  str = (char *)(sVar2 + 1);
  sVar2 = strlen(G_INI_NAME);
  if ((char *)0x104 < str + sVar2 + 1) {
    return false;
  }
  clear_path_string(str,(size_t)in_stack_fffffffffffffec8);
  strcpy(local_128,local_18);
  strcat(local_128,G_SLASH_CHAR);
  strcat(local_128,G_INI_NAME);
  _Var1 = exists_file(in_stack_fffffffffffffec8);
  if (!_Var1) {
    return false;
  }
  strcpy(g_ini_path,local_128);
  strcpy(g_ini_dir,local_18);
  if ((g_verbose & 1U) != 0) {
    console_message_string(str,in_stack_fffffffffffffec8);
  }
  return true;
}

Assistant:

bool set_ini_path(OpenJTalk *oj, const char *dir)
{
	if (dir == NULL || strlen(dir) == 0)
	{
		return false;
	}

	if (strlen(dir) + 1 + strlen(G_INI_NAME) + 1 > MAX_PATH)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);
	strcpy(temp, dir);
	strcat(temp, G_SLASH_CHAR);
	strcat(temp, G_INI_NAME);

	if (!exists_file(temp))
	{
		return false;
	}

	strcpy(g_ini_path, temp);
	strcpy(g_ini_dir, dir);

	if (g_verbose)
	{
		console_message_string(u8"設定ファイル： %s\n", g_ini_path);
	}
	return true;
}